

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpClient.cpp
# Opt level: O2

void __thiscall Liby::http::HttpClient::handleErroEvent(HttpClient *this,Connection *param_2)

{
  std::__cxx11::
  list<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>,_std::allocator<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>_>_>
  ::clear(&this->requestLists_);
  std::__shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->http_client_).super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->http_conn_).super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

void HttpClient::sendRequest() {
    auto &request = requestLists_.front().first;
    Buffer buffer(1024);
    buffer.append(request.toString());
    buffer.append(request.body_);
    http_conn_->send(buffer, [this] {
        http_conn_->enableRead();
        if (requestLists_.empty())
            return;
        sendRequest();
    });
    sendReqeustLists_.push_back(requestLists_.front());
    requestLists_.pop_front();
}